

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

void __thiscall minihttp::HttpSocket::~HttpSocket(HttpSocket *this)

{
  (this->super_TcpSocket)._vptr_TcpSocket = (_func_int **)&PTR__HttpSocket_0010eca0;
  Request::~Request(&this->_curRequest);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->_hdrs)._M_t);
  std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>::~deque(&(this->_requestQ).c);
  std::__cxx11::string::~string((string *)&this->_tmpHdr);
  std::__cxx11::string::~string((string *)&this->_accept_encoding);
  std::__cxx11::string::~string((string *)&this->_user_agent);
  TcpSocket::~TcpSocket(&this->super_TcpSocket);
  return;
}

Assistant:

HttpSocket::~HttpSocket()
{
}